

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# armci.c
# Opt level: O2

void convert_giov(armci_giov_t *a,comex_giov_t *b,int len)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar4 = 0;
  uVar5 = (ulong)(uint)len;
  if (len < 1) {
    uVar5 = uVar4;
  }
  for (; uVar5 * 0x18 - uVar4 != 0; uVar4 = uVar4 + 0x18) {
    puVar1 = (undefined8 *)((long)&a->src_ptr_array + uVar4);
    uVar3 = puVar1[1];
    puVar2 = (undefined8 *)((long)&b->src + uVar4);
    *puVar2 = *puVar1;
    puVar2[1] = uVar3;
    *(undefined8 *)((long)&b->count + uVar4) = *(undefined8 *)((long)&a->ptr_array_len + uVar4);
  }
  return;
}

Assistant:

static void convert_giov(armci_giov_t *a, comex_giov_t *b, int len)
{
    int i;
    for (i=0; i<len; ++i) {
        b[i].src = a[i].src_ptr_array;
        b[i].dst = a[i].dst_ptr_array;
        b[i].count = a[i].ptr_array_len;
        b[i].bytes = a[i].bytes;
    }
}